

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_context_output_format(unqlite_context *pCtx,char *zFormat,...)

{
  jx9_vm *pjVar1;
  char in_AL;
  int iVar2;
  sxu32 sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  SyBlob local_108;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &stack0x00000008;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  pjVar1 = pCtx->pVm;
  local_108.pBlob = (void *)0x0;
  local_108.nByte = 0;
  local_108.mByte = 0;
  local_108.nFlags = 0;
  local_108.pAllocator = &pjVar1->sAllocator;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  SyBlobFormatAp(&local_108,zFormat,&local_e8);
  if (local_108.nByte == 0) {
    sVar3 = 0;
    iVar2 = 0;
  }
  else {
    iVar2 = (*(pjVar1->sVmConsumer).xConsumer)
                      (local_108.pBlob,local_108.nByte,(pjVar1->sVmConsumer).pUserData);
    sVar3 = local_108.nByte;
  }
  pjVar1->nOutputLen = pjVar1->nOutputLen + sVar3;
  SyBlobRelease(&local_108);
  return iVar2;
}

Assistant:

int unqlite_context_output_format(unqlite_context *pCtx,const char *zFormat, ...)
{
	va_list ap;
	int rc;
	va_start(ap, zFormat);
	rc = jx9VmOutputConsumeAp(pCtx->pVm,zFormat, ap);
	va_end(ap);
	return rc;
}